

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textlabel.cpp
# Opt level: O3

int __thiscall QtMWidgets::TextLabel::heightForWidth(TextLabel *this,int w)

{
  int iVar1;
  int iVar2;
  double in_XMM1_Qa;
  undefined1 auVar3 [16];
  QTextDocument doc;
  QArrayData *local_50 [2];
  long local_40;
  QTextDocument local_38 [16];
  
  QStaticText::text();
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,8);
    }
  }
  if (local_40 == 0) {
    iVar2 = QFrame::frameWidth();
    iVar2 = iVar2 * 2;
  }
  else {
    auVar3 = QWidget::contentsMargins();
    iVar1 = QFrame::frameWidth();
    iVar2 = ((this->d).d)->margin;
    QTextDocument::QTextDocument(local_38,(QObject *)0x0);
    QStaticText::text();
    QTextDocument::setHtml((QString *)local_38);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,8);
      }
    }
    QTextDocument::setTextWidth((double)(w - (auVar3._8_4_ + auVar3._0_4_ + (iVar1 + iVar2) * 2)));
    QStaticText::textOption();
    QTextDocument::setDefaultTextOption((QTextOption *)local_38);
    QTextOption::~QTextOption((QTextOption *)local_50);
    QTextDocument::size();
    iVar2 = QFrame::frameWidth();
    iVar2 = (int)((double)(((this->d).d)->margin * 2) +
                 (double)auVar3._12_4_ + (double)auVar3._4_4_ + in_XMM1_Qa + (double)(iVar2 * 2));
    QTextDocument::~QTextDocument(local_38);
  }
  return iVar2;
}

Assistant:

int
TextLabel::heightForWidth( int w ) const
{
	if( text().isEmpty() )
		return 2 * frameWidth();

	const QMargins margins = contentsMargins();

	const qreal width = w - 2 * frameWidth() - margins.left() -
		margins.right() - 2 * d->margin;

	QTextDocument doc;
	doc.setHtml( d->staticText.text() );
	doc.setTextWidth( width );
	doc.setDefaultTextOption( d->staticText.textOption() );

	return doc.size().height() +
		2 * frameWidth() + margins.top() +
		margins.bottom() + 2 * d->margin;
}